

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content_chunked(Stream *strm,ContentReceiverWithProgress *out)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  FILE *pFVar6;
  size_t *__n;
  size_t *extraout_RDX;
  size_t *__n_00;
  size_t *__n_01;
  size_t *__n_02;
  Stream *__lineptr;
  char **__lineptr_00;
  FILE **__endptr;
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_d8;
  function<bool_(unsigned_long,_unsigned_long)> local_b8;
  FILE *local_98;
  char *end_ptr;
  unsigned_long chunk_len;
  undefined1 local_78 [8];
  stream_line_reader line_reader;
  char buf [16];
  int bufsiz;
  ContentReceiverWithProgress *out_local;
  Stream *strm_local;
  
  pFVar6 = (FILE *)0x10;
  __lineptr = strm;
  stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_78,strm,
             line_reader.glowable_buffer_.field_2._M_local_buf + 8,0x10);
  uVar4 = stream_line_reader::getline((stream_line_reader *)local_78,(char **)__lineptr,__n,pFVar6);
  if ((uVar4 & 1) == 0) {
    strm_local._7_1_ = false;
  }
  else {
    do {
      pcVar5 = stream_line_reader::ptr((stream_line_reader *)local_78);
      __endptr = &local_98;
      end_ptr = (char *)strtoul(pcVar5,(char **)__endptr,0x10);
      pFVar1 = local_98;
      pFVar6 = (FILE *)stream_line_reader::ptr((stream_line_reader *)local_78);
      __lineptr_00 = (char **)end_ptr;
      if (pFVar1 == pFVar6) {
        strm_local._7_1_ = false;
        goto LAB_0018df4f;
      }
      if (end_ptr == (char *)0xffffffffffffffff) {
        strm_local._7_1_ = false;
        goto LAB_0018df4f;
      }
      __n_02 = extraout_RDX;
      if (end_ptr == (char *)0x0) {
LAB_0018def1:
        if (end_ptr == (char *)0x0) {
          uVar4 = stream_line_reader::getline
                            ((stream_line_reader *)local_78,(char **)__endptr,__n_02,pFVar6);
          if ((uVar4 & 1) != 0) {
            pcVar5 = stream_line_reader::ptr((stream_line_reader *)local_78);
            iVar3 = strcmp(pcVar5,"\r\n");
            if (iVar3 == 0) goto LAB_0018df44;
          }
          strm_local._7_1_ = false;
        }
        else {
LAB_0018df44:
          strm_local._7_1_ = true;
        }
        goto LAB_0018df4f;
      }
      std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_b8,(nullptr_t)0x0);
      std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                (&local_d8,out);
      pFVar6 = (FILE *)&local_d8;
      bVar2 = read_content_with_length
                        (strm,(uint64_t)__lineptr_00,&local_b8,(ContentReceiverWithProgress *)pFVar6
                        );
      std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
                (&local_d8);
      std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_b8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        strm_local._7_1_ = false;
        goto LAB_0018df4f;
      }
      uVar4 = stream_line_reader::getline((stream_line_reader *)local_78,__lineptr_00,__n_00,pFVar6)
      ;
      if ((uVar4 & 1) == 0) {
        strm_local._7_1_ = false;
        goto LAB_0018df4f;
      }
      pcVar5 = stream_line_reader::ptr((stream_line_reader *)local_78);
      __endptr = (FILE **)0x1c237d;
      iVar3 = strcmp(pcVar5,"\r\n");
      __n_02 = __n_01;
      if (iVar3 != 0) goto LAB_0018def1;
      uVar4 = stream_line_reader::getline
                        ((stream_line_reader *)local_78,(char **)__endptr,__n_01,pFVar6);
    } while ((uVar4 & 1) != 0);
    strm_local._7_1_ = false;
  }
LAB_0018df4f:
  chunk_len._0_4_ = 1;
  stream_line_reader::~stream_line_reader((stream_line_reader *)local_78);
  return strm_local._7_1_;
}

Assistant:

inline bool read_content_chunked(Stream &strm,
                                 ContentReceiverWithProgress out) {
  const auto bufsiz = 16;
  char buf[bufsiz];

  stream_line_reader line_reader(strm, buf, bufsiz);

  if (!line_reader.getline()) { return false; }

  unsigned long chunk_len;
  while (true) {
    char *end_ptr;

    chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

    if (end_ptr == line_reader.ptr()) { return false; }
    if (chunk_len == ULONG_MAX) { return false; }

    if (chunk_len == 0) { break; }

    if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
      return false;
    }

    if (!line_reader.getline()) { return false; }

    if (strcmp(line_reader.ptr(), "\r\n")) { break; }

    if (!line_reader.getline()) { return false; }
  }

  if (chunk_len == 0) {
    // Reader terminator after chunks
    if (!line_reader.getline() || strcmp(line_reader.ptr(), "\r\n"))
      return false;
  }

  return true;
}